

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cc
# Opt level: O1

Result wabt::anon_unknown_0::FloatParser<double>::ParseFloat(char *s,char *end,Uint *out_bits)

{
  long lVar1;
  Enum EVar2;
  char *__nptr;
  long lVar3;
  char *pcVar4;
  double dVar5;
  undefined8 uStack_30;
  char acStack_28 [8];
  char *local_20;
  char *endptr;
  
  if (end < s) {
    uStack_30 = 0x162a8e;
    __assert_fail("s <= end",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/literal.cc"
                  ,0xa0,
                  "static Result wabt::(anonymous namespace)::FloatParser<double>::ParseFloat(const char *, const char *, Uint *) [T = double]"
                 );
  }
  lVar1 = -((ulong)(end + (0x10 - (long)s)) & 0xfffffffffffffff0);
  __nptr = acStack_28 + lVar1;
  lVar3 = (long)end - (long)s;
  pcVar4 = __nptr;
  if (lVar3 != 0) {
    do {
      if (*s != '_') {
        *pcVar4 = *s;
        pcVar4 = pcVar4 + 1;
      }
      s = s + 1;
    } while (s != end);
  }
  if (__nptr + lVar3 + 1 <= pcVar4) {
    *(code **)((long)&uStack_30 + lVar1) = ParseInt<unsigned_char>;
    __assert_fail("buffer_end < buffer + kBufferSize",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]wabt/src/literal.cc"
                  ,0xa5,
                  "static Result wabt::(anonymous namespace)::FloatParser<double>::ParseFloat(const char *, const char *, Uint *) [T = double]"
                 );
  }
  *pcVar4 = '\0';
  *(undefined8 *)((long)&uStack_30 + lVar1) = 0x162a3d;
  dVar5 = strtod(__nptr,&local_20);
  EVar2 = Error;
  if (((-INFINITY < dVar5) && (dVar5 < INFINITY)) && (local_20 == pcVar4)) {
    *out_bits = (Uint)dVar5;
    EVar2 = Ok;
  }
  return (Result)EVar2;
}

Assistant:

Result FloatParser<T>::ParseFloat(const char* s,
                                  const char* end,
                                  Uint* out_bits) {
  // Here is the normal behavior for strtof/strtod:
  //
  // input     | errno  |   output   |
  // ---------------------------------
  // overflow  | ERANGE | +-HUGE_VAL |
  // underflow | ERANGE |        0.0 |
  // otherwise |      0 |      value |
  //
  // So normally we need to clear errno before calling strto{f,d}, and check
  // afterward whether it was set to ERANGE.
  //
  // glibc seems to have a bug where
  // strtof("340282356779733661637539395458142568448") will return HUGE_VAL,
  // but will not set errno to ERANGE. Since this function is only called when
  // we know that we have parsed a "normal" number (i.e. not "inf"), we know
  // that if we ever get HUGE_VAL, it must be overflow.
  //
  // The WebAssembly spec also ignores underflow, so we don't need to check for
  // ERANGE at all.

  // WebAssembly floats can contain underscores, but strto* can't parse those,
  // so remove them first.
  assert(s <= end);
  const size_t kBufferSize = end - s + 1;  // +1 for \0.
  char* buffer = static_cast<char*>(alloca(kBufferSize));
  auto buffer_end =
      std::copy_if(s, end, buffer, [](char c) -> bool { return c != '_'; });
  assert(buffer_end < buffer + kBufferSize);
  *buffer_end = 0;

  char* endptr;
  Float value = Traits::Strto(buffer, &endptr);
  if (endptr != buffer_end ||
      (value == Traits::kHugeVal || value == -Traits::kHugeVal)) {
    return Result::Error;
  }

  memcpy(out_bits, &value, sizeof(value));
  return Result::Ok;
}